

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector1.cpp
# Opt level: O3

bool embree::avx2::
     BVHNIntersector1<4,_1,_false,_embree::avx2::ArrayIntersector1<embree::avx2::QuadMiIntersector1Moeller<4,_true>_>_>
     ::pointQuery(Intersectors *This,PointQuery *query,PointQueryContext *context)

{
  float fVar1;
  float fVar2;
  undefined4 uVar3;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar4;
  uint uVar5;
  uint uVar6;
  Geometry *this;
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 (*pauVar12) [16];
  bool bVar13;
  bool bVar14;
  uint uVar15;
  ulong uVar16;
  ulong uVar17;
  ulong uVar18;
  size_t i;
  long lVar19;
  undefined1 (*pauVar20) [16];
  ulong uVar21;
  long lVar22;
  byte bVar23;
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [64];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [64];
  undefined1 auVar35 [16];
  undefined1 auVar36 [64];
  vfloat<4> tNear;
  StackItemT<embree::NodeRefPtr<4>_> stack [244];
  undefined1 local_1008 [8];
  float fStack_1000;
  float fStack_ffc;
  undefined1 local_ff8 [16];
  undefined1 local_fe8 [16];
  undefined1 local_fd8 [16];
  long local_fc0;
  ulong local_fb8;
  long local_fb0;
  float local_fa8;
  float fStack_fa4;
  float fStack_fa0;
  float fStack_f9c;
  float local_f98;
  float fStack_f94;
  float fStack_f90;
  float fStack_f8c;
  undefined1 local_f88 [16];
  long local_f78;
  undefined4 uStack_f70;
  undefined1 local_f68 [3896];
  
  local_f78 = *(long *)&This->ptr[1].bounds.bounds0.lower.field_0;
  if (local_f78 == 8) {
    return false;
  }
  uStack_f70 = 0;
  fVar1 = (context->query_radius).field_0.m128[0];
  auVar26 = ZEXT1664(CONCAT412(fVar1,CONCAT48(fVar1,CONCAT44(fVar1,fVar1))));
  if (context->query_type == POINT_QUERY_TYPE_SPHERE) {
    local_ff8 = ZEXT416((uint)(query->radius * query->radius));
  }
  else {
    aVar4 = (context->query_radius).field_0;
    local_ff8 = vdpps_avx((undefined1  [16])aVar4,(undefined1  [16])aVar4,0x7f);
  }
  pauVar20 = (undefined1 (*) [16])local_f68;
  fVar2 = (query->p).field_0.field_0.x;
  auVar33._4_4_ = fVar2;
  auVar33._0_4_ = fVar2;
  auVar33._8_4_ = fVar2;
  auVar33._12_4_ = fVar2;
  uVar3 = *(undefined4 *)((long)&(query->p).field_0 + 4);
  local_f88._4_4_ = uVar3;
  local_f88._0_4_ = uVar3;
  local_f88._8_4_ = uVar3;
  local_f88._12_4_ = uVar3;
  auVar36 = ZEXT1664(local_f88);
  uVar3 = *(undefined4 *)((long)&(query->p).field_0 + 8);
  local_fe8._4_4_ = uVar3;
  local_fe8._0_4_ = uVar3;
  local_fe8._8_4_ = uVar3;
  local_fe8._12_4_ = uVar3;
  auVar34 = ZEXT1664(local_fe8);
  local_f98 = (context->query_radius).field_0.m128[1];
  fStack_f94 = local_f98;
  fStack_f90 = local_f98;
  fStack_f8c = local_f98;
  local_fa8 = (context->query_radius).field_0.m128[2];
  fStack_fa4 = local_fa8;
  fStack_fa0 = local_fa8;
  fStack_f9c = local_fa8;
  fVar1 = fVar1 * fVar1;
  auVar24._4_4_ = fVar1;
  auVar24._0_4_ = fVar1;
  auVar24._8_4_ = fVar1;
  auVar24._12_4_ = fVar1;
  bVar14 = false;
LAB_01929674:
  local_fd8 = auVar26._0_16_;
  auVar9 = vsubps_avx(auVar33,local_fd8);
  auVar25._0_4_ = fVar2 + auVar26._0_4_;
  auVar25._4_4_ = fVar2 + auVar26._4_4_;
  auVar25._8_4_ = fVar2 + auVar26._8_4_;
  auVar25._12_4_ = fVar2 + auVar26._12_4_;
  auVar10._4_4_ = fStack_f94;
  auVar10._0_4_ = local_f98;
  auVar10._8_4_ = fStack_f90;
  auVar10._12_4_ = fStack_f8c;
  auVar35 = auVar36._0_16_;
  auVar10 = vsubps_avx(auVar35,auVar10);
  auVar27._0_4_ = auVar36._0_4_ + local_f98;
  auVar27._4_4_ = auVar36._4_4_ + fStack_f94;
  auVar27._8_4_ = auVar36._8_4_ + fStack_f90;
  auVar27._12_4_ = auVar36._12_4_ + fStack_f8c;
  auVar11._4_4_ = fStack_fa4;
  auVar11._0_4_ = local_fa8;
  auVar11._8_4_ = fStack_fa0;
  auVar11._12_4_ = fStack_f9c;
  auVar11 = vsubps_avx(auVar34._0_16_,auVar11);
  auVar28._0_4_ = auVar34._0_4_ + local_fa8;
  auVar28._4_4_ = auVar34._4_4_ + fStack_fa4;
  auVar28._8_4_ = auVar34._8_4_ + fStack_fa0;
  auVar28._12_4_ = auVar34._12_4_ + fStack_f9c;
  while( true ) {
    pauVar12 = pauVar20 + -1;
    pauVar20 = pauVar20 + -1;
    if ((float)local_ff8._0_4_ < *(float *)(*pauVar12 + 8)) break;
    uVar16 = *(ulong *)*pauVar20;
LAB_019296bf:
    if (context->query_type == POINT_QUERY_TYPE_SPHERE) {
      if ((uVar16 & 8) != 0) {
LAB_01929a07:
        local_fc0 = (ulong)((uint)uVar16 & 0xf) - 8;
        if (local_fc0 == 0) break;
        lVar22 = (uVar16 & 0xfffffffffffffff0) + 0x50;
        local_fb0 = 0;
        uVar16 = 0;
        goto LAB_01929a28;
      }
      auVar29 = vmaxps_avx(auVar33,*(undefined1 (*) [16])(uVar16 + 0x20));
      auVar30 = vminps_avx(auVar29,*(undefined1 (*) [16])(uVar16 + 0x30));
      auVar29 = vmaxps_avx(auVar35,*(undefined1 (*) [16])(uVar16 + 0x40));
      auVar29 = vminps_avx(auVar29,*(undefined1 (*) [16])(uVar16 + 0x50));
      auVar30 = vsubps_avx(auVar30,auVar33);
      auVar31 = vsubps_avx(auVar29,auVar35);
      auVar29 = vmaxps_avx(auVar34._0_16_,*(undefined1 (*) [16])(uVar16 + 0x60));
      auVar29 = vminps_avx(auVar29,*(undefined1 (*) [16])(uVar16 + 0x70));
      auVar29 = vsubps_avx(auVar29,auVar34._0_16_);
      local_1008._0_4_ =
           auVar30._0_4_ * auVar30._0_4_ + auVar31._0_4_ * auVar31._0_4_ +
           auVar29._0_4_ * auVar29._0_4_;
      local_1008._4_4_ =
           auVar30._4_4_ * auVar30._4_4_ + auVar31._4_4_ * auVar31._4_4_ +
           auVar29._4_4_ * auVar29._4_4_;
      fStack_1000 = auVar30._8_4_ * auVar30._8_4_ + auVar31._8_4_ * auVar31._8_4_ +
                    auVar29._8_4_ * auVar29._8_4_;
      fStack_ffc = auVar30._12_4_ * auVar30._12_4_ + auVar31._12_4_ * auVar31._12_4_ +
                   auVar29._12_4_ * auVar29._12_4_;
      auVar29 = vcmpps_avx(_local_1008,auVar24,2);
      auVar30 = vcmpps_avx(*(undefined1 (*) [16])(uVar16 + 0x20),
                           *(undefined1 (*) [16])(uVar16 + 0x30),2);
      auVar29 = vandps_avx(auVar29,auVar30);
    }
    else {
      if ((uVar16 & 8) != 0) goto LAB_01929a07;
      auVar29 = *(undefined1 (*) [16])(uVar16 + 0x20);
      auVar30 = *(undefined1 (*) [16])(uVar16 + 0x30);
      auVar31 = vmaxps_avx(auVar33,auVar29);
      auVar31 = vminps_avx(auVar31,auVar30);
      auVar7 = vsubps_avx(auVar31,auVar33);
      auVar31 = vmaxps_avx(auVar35,*(undefined1 (*) [16])(uVar16 + 0x40));
      auVar31 = vminps_avx(auVar31,*(undefined1 (*) [16])(uVar16 + 0x50));
      auVar32 = vsubps_avx(auVar31,auVar35);
      auVar31 = vmaxps_avx(local_fe8,*(undefined1 (*) [16])(uVar16 + 0x60));
      auVar31 = vminps_avx(auVar31,*(undefined1 (*) [16])(uVar16 + 0x70));
      auVar31 = vsubps_avx(auVar31,local_fe8);
      local_1008._4_4_ =
           auVar7._4_4_ * auVar7._4_4_ + auVar32._4_4_ * auVar32._4_4_ +
           auVar31._4_4_ * auVar31._4_4_;
      local_1008._0_4_ =
           auVar7._0_4_ * auVar7._0_4_ + auVar32._0_4_ * auVar32._0_4_ +
           auVar31._0_4_ * auVar31._0_4_;
      fStack_1000 = auVar7._8_4_ * auVar7._8_4_ + auVar32._8_4_ * auVar32._8_4_ +
                    auVar31._8_4_ * auVar31._8_4_;
      fStack_ffc = auVar7._12_4_ * auVar7._12_4_ + auVar32._12_4_ * auVar32._12_4_ +
                   auVar31._12_4_ * auVar31._12_4_;
      auVar31 = vcmpps_avx(auVar29,auVar30,2);
      auVar7 = vcmpps_avx(*(undefined1 (*) [16])(uVar16 + 0x50),auVar10,5);
      auVar31 = vandps_avx(auVar31,auVar7);
      auVar34 = ZEXT1664(local_fe8);
      auVar29 = vcmpps_avx(auVar29,auVar25,2);
      auVar7 = vcmpps_avx(*(undefined1 (*) [16])(uVar16 + 0x40),auVar27,2);
      auVar29 = vandps_avx(auVar7,auVar29);
      auVar7 = vcmpps_avx(*(undefined1 (*) [16])(uVar16 + 0x70),auVar11,5);
      auVar31 = vandps_avx(auVar31,auVar7);
      auVar30 = vcmpps_avx(auVar30,auVar9,5);
      auVar7 = vcmpps_avx(*(undefined1 (*) [16])(uVar16 + 0x60),auVar28,2);
      auVar30 = vandps_avx(auVar30,auVar7);
      auVar29 = vandps_avx(auVar29,auVar30);
      auVar29 = vandps_avx(auVar31,auVar29);
    }
    auVar29 = vpslld_avx(auVar29,0x1f);
    uVar15 = vmovmskps_avx(auVar29);
    if (uVar15 != 0) {
      uVar15 = uVar15 & 0xff;
      uVar21 = uVar16 & 0xfffffffffffffff0;
      lVar22 = 0;
      for (uVar16 = (ulong)uVar15; (uVar16 & 1) == 0; uVar16 = uVar16 >> 1 | 0x8000000000000000) {
        lVar22 = lVar22 + 1;
      }
      uVar16 = *(ulong *)(uVar21 + lVar22 * 8);
      uVar15 = uVar15 - 1 & uVar15;
      uVar17 = (ulong)uVar15;
      if (uVar15 != 0) {
        uVar5 = *(uint *)(local_1008 + lVar22 * 4);
        lVar22 = 0;
        for (; (uVar17 & 1) == 0; uVar17 = uVar17 >> 1 | 0x8000000000000000) {
          lVar22 = lVar22 + 1;
        }
        uVar15 = uVar15 - 1 & uVar15;
        uVar18 = (ulong)uVar15;
        uVar17 = *(ulong *)(uVar21 + lVar22 * 8);
        uVar6 = *(uint *)(local_1008 + lVar22 * 4);
        if (uVar15 == 0) {
          if (uVar5 < uVar6) {
            *(ulong *)*pauVar20 = uVar17;
            *(uint *)(*pauVar20 + 8) = uVar6;
            pauVar20 = pauVar20 + 1;
          }
          else {
            *(ulong *)*pauVar20 = uVar16;
            *(uint *)(*pauVar20 + 8) = uVar5;
            pauVar20 = pauVar20 + 1;
            uVar16 = uVar17;
          }
        }
        else {
          auVar29._8_8_ = 0;
          auVar29._0_8_ = uVar16;
          auVar29 = vpunpcklqdq_avx(auVar29,ZEXT416(uVar5));
          auVar30._8_8_ = 0;
          auVar30._0_8_ = uVar17;
          auVar30 = vpunpcklqdq_avx(auVar30,ZEXT416(uVar6));
          lVar22 = 0;
          for (; (uVar18 & 1) == 0; uVar18 = uVar18 >> 1 | 0x8000000000000000) {
            lVar22 = lVar22 + 1;
          }
          uVar15 = uVar15 - 1 & uVar15;
          uVar16 = (ulong)uVar15;
          auVar31._8_8_ = 0;
          auVar31._0_8_ = *(ulong *)(uVar21 + lVar22 * 8);
          auVar7 = vpunpcklqdq_avx(auVar31,ZEXT416(*(uint *)(local_1008 + lVar22 * 4)));
          auVar31 = vpcmpgtd_avx(auVar30,auVar29);
          if (uVar15 == 0) {
            auVar32 = vpshufd_avx(auVar31,0xaa);
            auVar31 = vblendvps_avx(auVar30,auVar29,auVar32);
            auVar29 = vblendvps_avx(auVar29,auVar30,auVar32);
            auVar30 = vpcmpgtd_avx(auVar7,auVar31);
            auVar32 = vpshufd_avx(auVar30,0xaa);
            auVar30 = vblendvps_avx(auVar7,auVar31,auVar32);
            auVar31 = vblendvps_avx(auVar31,auVar7,auVar32);
            auVar7 = vpcmpgtd_avx(auVar31,auVar29);
            auVar32 = vpshufd_avx(auVar7,0xaa);
            auVar7 = vblendvps_avx(auVar31,auVar29,auVar32);
            auVar29 = vblendvps_avx(auVar29,auVar31,auVar32);
            *pauVar20 = auVar29;
            pauVar20[1] = auVar7;
            uVar16 = auVar30._0_8_;
            pauVar20 = pauVar20 + 2;
          }
          else {
            lVar22 = 0;
            for (; (uVar16 & 1) == 0; uVar16 = uVar16 >> 1 | 0x8000000000000000) {
              lVar22 = lVar22 + 1;
            }
            auVar32._8_8_ = 0;
            auVar32._0_8_ = *(ulong *)(uVar21 + lVar22 * 8);
            auVar8 = vpunpcklqdq_avx(auVar32,ZEXT416(*(uint *)(local_1008 + lVar22 * 4)));
            auVar32 = vpshufd_avx(auVar31,0xaa);
            auVar31 = vblendvps_avx(auVar30,auVar29,auVar32);
            auVar29 = vblendvps_avx(auVar29,auVar30,auVar32);
            auVar30 = vpcmpgtd_avx(auVar8,auVar7);
            auVar32 = vpshufd_avx(auVar30,0xaa);
            auVar30 = vblendvps_avx(auVar8,auVar7,auVar32);
            auVar7 = vblendvps_avx(auVar7,auVar8,auVar32);
            auVar32 = vpcmpgtd_avx(auVar7,auVar29);
            auVar8 = vpshufd_avx(auVar32,0xaa);
            auVar32 = vblendvps_avx(auVar7,auVar29,auVar8);
            auVar29 = vblendvps_avx(auVar29,auVar7,auVar8);
            auVar7 = vpcmpgtd_avx(auVar30,auVar31);
            auVar8 = vpshufd_avx(auVar7,0xaa);
            auVar7 = vblendvps_avx(auVar30,auVar31,auVar8);
            auVar30 = vblendvps_avx(auVar31,auVar30,auVar8);
            auVar31 = vpcmpgtd_avx(auVar32,auVar30);
            auVar8 = vpshufd_avx(auVar31,0xaa);
            auVar31 = vblendvps_avx(auVar32,auVar30,auVar8);
            auVar30 = vblendvps_avx(auVar30,auVar32,auVar8);
            *pauVar20 = auVar29;
            pauVar20[1] = auVar30;
            pauVar20[2] = auVar31;
            uVar16 = auVar7._0_8_;
            pauVar20 = pauVar20 + 3;
          }
        }
      }
      goto LAB_019296bf;
    }
    if (pauVar20 == (undefined1 (*) [16])&local_f78) {
      return bVar14;
    }
  }
  auVar26 = ZEXT1664(local_fd8);
  goto LAB_01929b1c;
LAB_01929a28:
  do {
    local_fb8 = uVar16;
    bVar23 = 0;
    lVar19 = 0;
    do {
      if (*(int *)(lVar22 + lVar19 * 4) == -1) break;
      uVar15 = *(uint *)(lVar22 + -0x10 + lVar19 * 4);
      this = (context->scene->geometries).items[uVar15].ptr;
      context->geomID = uVar15;
      context->primID = *(uint *)(lVar22 + lVar19 * 4);
      bVar13 = Geometry::pointQuery(this,query,context);
      auVar34 = ZEXT1664(local_fe8);
      auVar36 = ZEXT1664(local_f88);
      bVar23 = bVar23 | bVar13;
      lVar19 = lVar19 + 1;
    } while (lVar19 != 4);
    uVar16 = CONCAT71((int7)(local_fb8 >> 8),(byte)local_fb8 | bVar23);
    local_fb0 = local_fb0 + 1;
    lVar22 = lVar22 + 0x60;
  } while (local_fb0 != local_fc0);
  if ((local_fb8 & 1) == 0 && bVar23 == 0) {
    auVar26 = ZEXT1664(local_fd8);
  }
  else {
    uVar3 = *(undefined4 *)&(context->query_radius).field_0;
    auVar26 = ZEXT1664(CONCAT412(uVar3,CONCAT48(uVar3,CONCAT44(uVar3,uVar3))));
    local_f98 = (context->query_radius).field_0.m128[1];
    fStack_f94 = local_f98;
    fStack_f90 = local_f98;
    fStack_f8c = local_f98;
    local_fa8 = (context->query_radius).field_0.m128[2];
    fStack_fa4 = local_fa8;
    fStack_fa0 = local_fa8;
    fStack_f9c = local_fa8;
    if (context->query_type == POINT_QUERY_TYPE_SPHERE) {
      local_ff8 = ZEXT416((uint)(query->radius * query->radius));
    }
    else {
      aVar4 = (context->query_radius).field_0;
      local_ff8 = vdpps_avx((undefined1  [16])aVar4,(undefined1  [16])aVar4,0x7f);
    }
    bVar14 = true;
  }
LAB_01929b1c:
  auVar24._0_4_ = auVar26._0_4_ * auVar26._0_4_;
  auVar24._4_4_ = auVar26._4_4_ * auVar26._4_4_;
  auVar24._8_4_ = auVar26._8_4_ * auVar26._8_4_;
  auVar24._12_4_ = auVar26._12_4_ * auVar26._12_4_;
  if (pauVar20 == (undefined1 (*) [16])&local_f78) {
    return bVar14;
  }
  goto LAB_01929674;
}

Assistant:

static __forceinline bool pointQuery(const Accel::Intersectors* This, PointQuery* query, PointQueryContext* context)
      {
        const BVH* __restrict__ bvh = (const BVH*)This->ptr;
        
        /* we may traverse an empty BVH in case all geometry was invalid */
        if (bvh->root == BVH::emptyNode)
          return false;
        
        /* stack state */
        StackItemT<NodeRef> stack[stackSize];    // stack of nodes
        StackItemT<NodeRef>* stackPtr = stack+1; // current stack pointer
        StackItemT<NodeRef>* stackEnd = stack+stackSize;
        stack[0].ptr  = bvh->root;
        stack[0].dist = neg_inf;
        
        /* verify correct input */
        assert(!(types & BVH_MB) || (query->time >= 0.0f && query->time <= 1.0f));

        /* load the point query into SIMD registers */
        TravPointQuery<N> tquery(query->p, context->query_radius);

        /* initialize the node traverser */
        BVHNNodeTraverser1Hit<N,types> nodeTraverser;

        bool changed = false;
        float cull_radius = context->query_type == POINT_QUERY_TYPE_SPHERE
                          ? query->radius * query->radius
                          : dot(context->query_radius, context->query_radius);

        /* pop loop */
        while (true) pop:
        {
          /* pop next node */
          if (unlikely(stackPtr == stack)) break;
          stackPtr--;
          NodeRef cur = NodeRef(stackPtr->ptr);

          /* if popped node is too far, pop next one */
          if (unlikely(*(float*)&stackPtr->dist > cull_radius))
            continue;

          /* downtraversal loop */
          while (true)
          {
            /* intersect node */
            size_t mask; vfloat<N> tNear;
            STAT3(point_query.trav_nodes,1,1,1);
            bool nodeIntersected;
            if (likely(context->query_type == POINT_QUERY_TYPE_SPHERE)) {
              nodeIntersected = BVHNNodePointQuerySphere1<N, types>::pointQuery(cur, tquery, query->time, tNear, mask);
            } else {
              nodeIntersected = BVHNNodePointQueryAABB1  <N, types>::pointQuery(cur, tquery, query->time, tNear, mask);
            }
            if (unlikely(!nodeIntersected)) { STAT3(point_query.trav_nodes,-1,-1,-1); break; }

            /* if no child is hit, pop next node */
            if (unlikely(mask == 0))
              goto pop;

            /* select next child and push other children */
            nodeTraverser.traverseClosestHit(cur, mask, tNear, stackPtr, stackEnd);
          }

          /* this is a leaf node */
          assert(cur != BVH::emptyNode);
          STAT3(point_query.trav_leaves,1,1,1);
          size_t num; Primitive* prim = (Primitive*)cur.leaf(num);
          size_t lazy_node = 0;
          if (PrimitiveIntersector1::pointQuery(This, query, context, prim, num, tquery, lazy_node))
          {
            changed = true;
            tquery.rad = context->query_radius;
            cull_radius = context->query_type == POINT_QUERY_TYPE_SPHERE
                        ? query->radius * query->radius
                        : dot(context->query_radius, context->query_radius);
          }

          /* push lazy node onto stack */
          if (unlikely(lazy_node)) {
            stackPtr->ptr = lazy_node;
            stackPtr->dist = neg_inf;
            stackPtr++;
          }
        }
        return changed;
      }